

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfileinfogatherer_p.cpp
# Opt level: O1

void QFileInfoGatherer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QFileInfoGatherer_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((((code *)*plVar1 == updates) && (uVar2 = 0, plVar1[1] == 0)) ||
         (((code *)*plVar1 == newListOfFiles && (uVar2 = 1, plVar1[1] == 0)))) ||
        (((code *)*plVar1 == nameResolved && (uVar2 = 2, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == directoryLoaded && (uVar2 = 3, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_0061acd6;
  }
  if (_c != InvokeMetaMethod) goto LAB_0061acd6;
  switch(_id) {
  case 0:
    local_38.ptr = (QString *)_a[1];
    local_38.size = (qsizetype)_a[2];
    iVar3 = 0;
    goto LAB_0061ac66;
  case 1:
    local_38.ptr = (QString *)_a[1];
    local_38.size = (qsizetype)_a[2];
    iVar3 = 1;
    goto LAB_0061ac66;
  case 2:
    local_38.ptr = (QString *)_a[1];
    local_38.size = (qsizetype)_a[2];
    iVar3 = 2;
    goto LAB_0061ac66;
  case 3:
    local_38.ptr = (QString *)_a[1];
    iVar3 = 3;
LAB_0061ac66:
    local_38.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_38.d);
    break;
  case 4:
    local_38.d = (Data *)0x0;
    local_38.ptr = (QString *)0x0;
    local_38.size = 0;
    fetchExtendedInformation((QFileInfoGatherer *)_o,(QString *)_a[1],(QStringList *)&local_38);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
    break;
  case 5:
    fetchExtendedInformation((QFileInfoGatherer *)_o,(QString *)_a[1],(QStringList *)_a[2]);
    break;
  case 6:
    updateFile((QFileInfoGatherer *)_o,(QString *)_a[1]);
    break;
  case 8:
    *(undefined8 *)(_o + 0x58) = *_a[1];
    break;
  case 9:
    driveAdded((QFileInfoGatherer *)_o);
    break;
  case 10:
    driveRemoved((QFileInfoGatherer *)_o);
  }
LAB_0061acd6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileInfoGatherer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileInfoGatherer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updates((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<std::pair<QString,QFileInfo>>>>(_a[2]))); break;
        case 1: _t->newListOfFiles((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 2: _t->nameResolved((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->list((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->fetchExtendedInformation((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 6: _t->updateFile((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->setResolveSymlinks((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setIconProvider((*reinterpret_cast< std::add_pointer_t<QAbstractFileIconProvider*>>(_a[1]))); break;
        case 9: _t->driveAdded(); break;
        case 10: _t->driveRemoved(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QList<std::pair<QString,QFileInfo>> & )>(_a, &QFileInfoGatherer::updates, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QStringList & ) const>(_a, &QFileInfoGatherer::newListOfFiles, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QString & ) const>(_a, &QFileInfoGatherer::nameResolved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & )>(_a, &QFileInfoGatherer::directoryLoaded, 3))
            return;
    }
}